

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::InlineApplyBuiltInTargetWithArray
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *applyInfo,
          FunctionJITTimeInfo *builtInInfo,bool *pIsInlined)

{
  code *pcVar1;
  BuiltinFunction BVar2;
  bool bVar3;
  uint localFuncId;
  HelperCallOpnd *pHVar4;
  undefined4 *puVar5;
  Opnd *opnd;
  ByteCodeUsesInstr *this_00;
  Instr *pIVar6;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  StackSym *pSVar7;
  SymOpnd *pSVar8;
  Inline *pIVar9;
  Instr *local_b8;
  Instr *implicitThisArgOut;
  AutoReuseOpnd autoReuseOriginalCallSrc1;
  Instr *applyLdInstr;
  PragmaInstr *pPStack_88;
  uint argOutCount;
  Instr *explicitThisArgOut;
  Instr *arrayArgOut;
  Instr *applyTargetLdInstr;
  PragmaInstr *local_68;
  Instr *local_60;
  Instr *local_58;
  HelperCallOpnd *local_50;
  Instr *local_48;
  bool *local_40;
  OpCode local_32;
  
  pIVar6 = callInstr->m_next;
  applyTargetLdInstr = (Instr *)applyInfo;
  localFuncId = FunctionJITTimeInfo::GetLocalFunctionId(builtInInfo);
  BVar2 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
  if (BVar2._value == '$') {
    pIVar9 = (Inline *)0x79;
  }
  else {
    if (BVar2._value != '%') {
      return pIVar6;
    }
    pIVar9 = (Inline *)0x7a;
  }
  local_48 = pIVar6;
  local_40 = pIsInlined;
  pHVar4 = IR::HelperCallOpnd::New((JnHelperMethod)pIVar9,callInstr->m_func);
  local_b8 = (Instr *)0x0;
  pPStack_88 = (PragmaInstr *)0x0;
  explicitThisArgOut = (Instr *)0x0;
  applyLdInstr._4_4_ = 0;
  GetArgInstrsForCallAndApply
            (pIVar9,callInstr,&local_b8,(Instr **)&stack0xffffffffffffff78,&explicitThisArgOut,
             (uint *)((long)&applyLdInstr + 4));
  local_58 = local_b8;
  if (local_b8 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa83,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar3) goto LAB_00557f78;
    *puVar5 = 0;
  }
  local_68 = pPStack_88;
  if (pPStack_88 == (PragmaInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa84,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar3) goto LAB_00557f78;
    *puVar5 = 0;
  }
  local_60 = explicitThisArgOut;
  if (explicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa85,"(arrayArgOut)","arrayArgOut");
    if (!bVar3) {
LAB_00557f78:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  local_32 = callInstr->m_opcode;
  local_50 = pHVar4;
  opnd = IR::Opnd::Copy(callInstr->m_src1,this->topFunc);
  pIVar9 = (Inline *)&implicitThisArgOut;
  implicitThisArgOut = (Instr *)0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)pIVar9,opnd,this->topFunc,true);
  autoReuseOriginalCallSrc1.autoDelete = false;
  autoReuseOriginalCallSrc1.wasInUse = false;
  autoReuseOriginalCallSrc1._18_6_ = 0;
  arrayArgOut = (Instr *)0x0;
  bVar3 = TryGetCallApplyAndTargetLdInstrs
                    (pIVar9,callInstr,(Instr **)&autoReuseOriginalCallSrc1.autoDelete,&arrayArgOut);
  if (bVar3) {
    *local_40 = true;
    IR::Instr::ReplaceSrc1(callInstr,arrayArgOut->m_dst);
    this_00 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                        (this,callInstr,callInstr,builtInInfo,false,true,false,true);
    if (this_00 != (ByteCodeUsesInstr *)0x0) {
      IR::Instr::Remove(&this_00->super_Instr);
    }
    callInstr->m_opcode = local_32;
    IR::Instr::ReplaceSrc1(callInstr,opnd);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns
              (this,callInstr,callInstr,(FunctionJITTimeInfo *)applyTargetLdInstr,false,true,false,
               true);
    pIVar6 = InsertInlineeBuiltInStartEndTags(this,callInstr,3,(Instr **)0x0);
    pIVar6->m_opcode = InlineNonTrackingBuiltInEnd;
    dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
    src1Opnd = IR::IntConstOpnd::New(2,TyInt32,callInstr->m_func,false);
    pIVar6 = IR::Instr::New(StartCall,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
    pSVar8 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
    pIVar6 = IR::Instr::New(ArgOut_A,&pSVar8->super_Opnd,(local_68->super_Instr).m_src1,
                            pIVar6->m_dst,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,2);
    pSVar8 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
    pIVar6 = IR::Instr::New(ArgOut_A,&pSVar8->super_Opnd,local_60->m_src1,pIVar6->m_dst,
                            callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
    pSVar8 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyUint64,callInstr->m_func);
    pIVar6 = IR::Instr::New(ArgOut_A_InlineSpecialized,&pSVar8->super_Opnd,local_58->m_src1,
                            pIVar6->m_dst,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    callInstr->m_opcode = CallDirect;
    IR::Instr::ReplaceSrc1(callInstr,&local_50->super_Opnd);
    IR::Instr::ReplaceSrc2(callInstr,pIVar6->m_dst);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&implicitThisArgOut);
  return local_48;
}

Assistant:

IR::Instr * Inline::InlineApplyBuiltInTargetWithArray(IR::Instr * callInstr, const FunctionJITTimeInfo * applyInfo, const FunctionJITTimeInfo * builtInInfo, bool * pIsInlined)
{
    IR::Instr * instrNext = callInstr->m_next;
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(builtInInfo->GetLocalFunctionId());
    IR::HelperCallOpnd * helperCallOpnd = nullptr;
    switch (builtInId)
    {
    case Js::BuiltinFunction::Math_Max:
        helperCallOpnd = IR::HelperCallOpnd::New(IR::HelperOp_MaxInAnArray, callInstr->m_func);
        break;

    case Js::BuiltinFunction::Math_Min:
        helperCallOpnd = IR::HelperCallOpnd::New(IR::HelperOp_MinInAnArray, callInstr->m_func);
        break;

    default:
        return instrNext;
    }

    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * arrayArgOut = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &arrayArgOut, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);
    Assert(arrayArgOut);
    Js::OpCode originalCallOpcode = callInstr->m_opcode;
    IR::Opnd * originalCallSrc1 = callInstr->GetSrc1()->Copy(this->topFunc);
    IR::AutoReuseOpnd autoReuseOriginalCallSrc1(originalCallSrc1, this->topFunc);

    IR::Instr* applyLdInstr = nullptr;
    IR::Instr* applyTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &applyLdInstr, &applyTargetLdInstr))
    {
        return instrNext;
    }

    *pIsInlined = true;
    // Fixed function/function object checks for target built-in
    callInstr->ReplaceSrc1(applyTargetLdInstr->GetDst());
    {
        IR::ByteCodeUsesInstr * useCallTargetInstr =
            EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, builtInInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);
        if (useCallTargetInstr)
        {
            // The applyTarget dst already has a use in the argout, this bytecode use is not valid
            useCallTargetInstr->Remove();
        }
    }

    // Fixed function/function object checks for .apply
    callInstr->m_opcode = originalCallOpcode;
    callInstr->ReplaceSrc1(originalCallSrc1);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, applyInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr* builtInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, 3); // 3 args (implicit this + explicit this + array = 3)
    builtInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd; // We will call EndTrackCall when we see CallDirect for reasons explained in GlobOpt::TrackCalls

    IR::Instr * startCall = IR::Instr::New(Js::OpCode::StartCall,
                                           IR::RegOpnd::New(TyVar, callInstr->m_func),
                                           IR::IntConstOpnd::New(2, TyInt32, callInstr->m_func),
                                           callInstr->m_func);
    callInstr->InsertBefore(startCall);

    IR::Opnd * linkOpnd;
    StackSym * sym;

    sym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    linkOpnd = IR::SymOpnd::New(sym, 0, TyVar, callInstr->m_func);
    IR::Instr * argOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, explicitThisArgOut->GetSrc1(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    sym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(2));
    linkOpnd = IR::SymOpnd::New(sym, 0, TyVar, callInstr->m_func);
    argOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, arrayArgOut->GetSrc1(), argOut->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    linkOpnd = IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1)), 0, TyMachPtr, callInstr->m_func);
    argOut = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, linkOpnd, implicitThisArgOut->GetSrc1(), argOut->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    callInstr->m_opcode = Js::OpCode::CallDirect;
    callInstr->ReplaceSrc1(helperCallOpnd);
    callInstr->ReplaceSrc2(argOut->GetDst());

    return instrNext;
}